

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O0

void __thiscall
spdlog::details::async_msg::async_msg
          (async_msg *this,async_logger_ptr *worker,async_msg_type the_type)

{
  allocator<char> local_1d;
  async_msg_type local_1c;
  async_logger_ptr *paStack_18;
  async_msg_type the_type_local;
  async_logger_ptr *worker_local;
  async_msg *this_local;
  
  this->msg_type = the_type;
  this->level = off;
  local_1c = the_type;
  paStack_18 = worker;
  worker_local = (async_logger_ptr *)this;
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->time);
  this->thread_id = 0;
  std::allocator<char>::allocator();
  ::fmt::v5::basic_memory_buffer<char,_176UL,_std::allocator<char>_>::basic_memory_buffer
            (&this->raw,&local_1d);
  std::allocator<char>::~allocator(&local_1d);
  this->msg_id = 0;
  source_loc::source_loc(&this->source);
  std::shared_ptr<spdlog::async_logger>::shared_ptr(&this->worker_ptr,paStack_18);
  return;
}

Assistant:

async_msg(async_logger_ptr &&worker, async_msg_type the_type)
        : msg_type(the_type)
        , level(level::off)
        , time()
        , thread_id(0)
        , msg_id(0)
        , source()
        , worker_ptr(std::move(worker))
    {
    }